

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O3

Am_Value __thiscall Am_Value_List::Pop(Am_Value_List *this,bool unique)

{
  Am_Value_List_Data *pAVar1;
  Am_List_Item *initial;
  bool in_DL;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  undefined7 in_register_00000031;
  Am_Value_List *this_00;
  Am_Value AVar2;
  
  this_00 = (Am_Value_List *)CONCAT71(in_register_00000031,unique);
  pAVar1 = this_00->data;
  if ((pAVar1 != (Am_Value_List_Data *)0x0) &&
     (*(short *)&(pAVar1->super_Am_Wrapper).field_0xc != 0)) {
    initial = pAVar1->head;
    this_00->item = initial;
    if (initial != (Am_List_Item *)0x0) {
      Am_Value::Am_Value((Am_Value *)this,&initial->super_Am_Value);
      Delete(this_00,in_DL);
      AVar2.value.wrapper_value = extraout_RDX.wrapper_value;
      AVar2._0_8_ = this;
      return AVar2;
    }
    Am_Error("** Am_Value_List::Get: no item is current\n");
  }
  Am_Error("** Pop on empty list");
}

Assistant:

bool
Am_Value_List::Empty() const
{
  if (data)
    return data->number == 0;
  else
    return true;
}